

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O1

Status __thiscall
mognetwork::protocol::TextProtocol::onReadAllTrigger(TextProtocol *this,Data *data)

{
  size_t sVar1;
  pointer *ppcVar2;
  char *__s;
  pointer pcVar3;
  pointer __dest;
  pointer pcVar4;
  Data *pDVar5;
  Status SVar6;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  size_t readed;
  char buffer [1024];
  size_t local_458;
  Status local_44c;
  Data *local_448;
  Data *local_440;
  char local_438 [1032];
  
  local_440 = &(this->super_AProtocolListener).m_pendingDatas.datas;
  bVar9 = false;
  local_448 = data;
  do {
    if (bVar9) {
      return Ok;
    }
    SVar6 = TcpSocket::receive((this->super_AProtocolListener).m_socket,local_438,0x3ff,&local_458,0
                              );
    if (SVar6 == Ok) {
      sVar1 = local_458 + 1;
      local_438[local_458] = '\0';
      local_458 = sVar1;
      std::vector<char,_std::allocator<char>_>::resize
                (local_440,
                 (size_type)
                 ((this->super_AProtocolListener).m_pendingDatas.datas.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_finish +
                 (sVar1 - (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start)),'\0');
      strcat((this->super_AProtocolListener).m_pendingDatas.datas.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,local_438);
      __s = (this->super_AProtocolListener).m_pendingDatas.datas.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      ;
      pcVar7 = strchr(__s,10);
      pDVar5 = local_448;
      if (pcVar7 != (char *)0x0) {
        iVar8 = (int)((long)pcVar7 - (long)__s);
        if (iVar8 == 0) {
          iVar8 = 3;
          if ((this->super_AProtocolListener).m_pendingDatas.datas.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish != __s) {
            (this->super_AProtocolListener).m_pendingDatas.datas.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish = __s;
          }
          goto LAB_0010a892;
        }
        std::vector<char,_std::allocator<char>_>::resize
                  (local_448,((long)pcVar7 - (long)__s) + 2,'\0');
        pcVar3 = (this->super_AProtocolListener).m_pendingDatas.datas.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        memcpy((pDVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start,pcVar3,(long)pcVar7 - (long)pcVar3);
        (pDVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish[-1] = '\0';
        bVar9 = true;
        if (-1 < iVar8 &&
            (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)(this->super_AProtocolListener).m_pendingDatas.datas.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start != (long)(iVar8 + 2)) {
          iVar8 = ((int)pcVar7 - (int)__s) + 1;
          do {
            __dest = (this->super_AProtocolListener).m_pendingDatas.datas.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            pcVar4 = (this->super_AProtocolListener).m_pendingDatas.datas.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish;
            pcVar3 = __dest + 1;
            if (pcVar3 != pcVar4) {
              memmove(__dest,pcVar3,(long)pcVar4 - (long)pcVar3);
            }
            ppcVar2 = &(this->super_AProtocolListener).m_pendingDatas.datas.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar2 = *ppcVar2 + -1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
      }
      iVar8 = 0;
    }
    else {
      iVar8 = 1;
      local_44c = SVar6;
    }
LAB_0010a892:
    if (iVar8 != 0) {
      SVar6 = Ok;
      if (iVar8 != 3) {
        SVar6 = local_44c;
      }
      return SVar6;
    }
  } while( true );
}

Assistant:

Socket::Status TextProtocol::onReadAllTrigger(TcpSocket::Data& data)
    {
      bool received = false;

      while (!received)
	{
	  std::size_t readed;
	  char buffer[1024];
	  
	  Socket::Status status = m_socket->receive(buffer, 1023, readed, 0);
	  if (status != Socket::Ok)
	    return status;
	  buffer[readed++] = 0;
	  m_pendingDatas.datas.resize(m_pendingDatas.datas.size() + readed);
	  std::strcat(&m_pendingDatas.datas[0], buffer);
	  char* l;
	  if ((l = std::strstr(&m_pendingDatas.datas[0], "\n")) != NULL)
	    {
	      int size = l - &m_pendingDatas.datas[0];
	      if (size == 0)
		{
		  m_pendingDatas.datas.clear();
		  break;
		}
	      
	      data.resize(l - &m_pendingDatas.datas[0] + 2);
	      std::memcpy(&data[0],
			  &m_pendingDatas.datas[0],
			  l - &m_pendingDatas.datas[0]);
	      data[data.size() - 1] = 0;
	      if (m_pendingDatas.datas.size() != size + 2)
		for (int i = 0; i < size + 1; ++i)
		  m_pendingDatas.datas.erase(m_pendingDatas.datas.begin());
	      received = true;
	    }
	}
      return Socket::Ok;
    }